

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O2

int read_history(char *filename)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  undefined8 uStack_120;
  char buf [256];
  
  uStack_120 = 0x11bb06;
  hist_alloc();
  uStack_120 = 0x11bb15;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    H_0 = 0;
    while (H_0 < el_hist_size) {
      uStack_120 = 0x11bb41;
      pcVar2 = fgets(buf,0x100,__stream);
      if (pcVar2 == (char *)0x0) break;
      uStack_120 = 0x11bb4e;
      sVar3 = strlen(buf);
      buf[sVar3 - 1] = '\0';
      uStack_120 = 0x11bb5c;
      add_history(buf);
    }
    uStack_120 = 0x11bb6c;
    iVar1 = fclose(__stream);
  }
  return iVar1;
}

Assistant:

int read_history(const char *filename)
{
    FILE *fp;
    char buf[SCREEN_INC];

    hist_alloc();

    fp = fopen(filename, "r");
    if (!fp)
	return EOF;

    H.Size = 0;
    while (H.Size < el_hist_size) {
	if (!fgets(buf, SCREEN_INC, fp))
	    break;

	buf[strlen(buf) - 1] = 0; /* Remove '\n' */
	add_history(buf);
    }

    return fclose(fp);
}